

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O1

void * bsp_create(int dimensions)

{
  long *plVar1;
  void *pvVar2;
  float *pfVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  int *piVar6;
  ulong uVar7;
  
  plVar1 = (long *)malloc(0x18);
  *(char *)(plVar1 + 1) = (char)dimensions;
  *(undefined1 *)((long)plVar1 + 9) = 0x40;
  *(undefined4 *)((long)plVar1 + 10) = 0x40;
  *(undefined2 *)((long)plVar1 + 0xe) = 0;
  pvVar2 = malloc((long)dimensions * 8 + 8);
  *plVar1 = (long)pvVar2;
  if (0 < dimensions) {
    uVar7 = 0;
    do {
      pfVar3 = array_create_float(0x20);
      *(float **)(*plVar1 + uVar7 * 8) = pfVar3;
      uVar7 = uVar7 + 1;
    } while ((uint)dimensions != uVar7);
  }
  ppvVar4 = array_create_ptr(0x20);
  *(void ***)(*plVar1 + (ulong)*(byte *)(plVar1 + 1) * 8) = ppvVar4;
  puVar5 = (undefined8 *)malloc(0x28);
  *puVar5 = plVar1;
  piVar6 = array_create_int(4);
  puVar5[1] = piVar6;
  *(undefined2 *)(puVar5 + 2) = 0xffff;
  *(undefined8 *)((long)puVar5 + 0x14) = 0;
  *(undefined8 *)((long)puVar5 + 0x1c) = 0;
  *(undefined4 *)((long)puVar5 + 0x24) = 0;
  plVar1[2] = (long)puVar5;
  return plVar1;
}

Assistant:

void *
bsp_create(
    int dimensions )
{
    bsp_tree * tree;
    int i;

    assert( dimensions > 0 && dimensions < 128 );

    tree = (bsp_tree *)malloc( sizeof( bsp_tree ) );
    assert( tree != NULL );

    tree->dimensions = dimensions;
    tree->flags = 0;
    tree->maxdepth = 64;
    tree->maxnodepoints = 64;
    tree->mempoolid = 0;

    tree->pointarrays = (float **)malloc( sizeof(float *) * (dimensions + 1) );
    assert( tree->pointarrays != NULL );

    for ( i = 0; i < dimensions; i++ ) {
        tree->pointarrays[i] = array_create_float( 32 );
        assert( tree->pointarrays[i] != NULL );
    }
    tree->pointarrays[tree->dimensions] = (float *) array_create_ptr( 32 );
    assert( tree->pointarrays[tree->dimensions] != NULL );

    tree->top = _bsp_create_node( tree );
    return (void *) tree;
}